

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

error_code __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
set_option<asio::detail::socket_option::boolean<1,2>>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          boolean<1,_2> *option,error_code *ec)

{
  int __fd;
  int __optname;
  uint uVar1;
  int *piVar2;
  error_code eVar3;
  error_code *ec_local;
  boolean<1,_2> *option_local;
  implementation_type *impl_local;
  reactive_socket_service<asio::ip::tcp> *this_local;
  
  __fd = (impl->super_base_implementation_type).socket_;
  __optname = socket_option::boolean<1,_2>::level<asio::ip::tcp>(option,&impl->protocol_);
  uVar1 = socket_option::boolean<1,_2>::name<asio::ip::tcp>(option,&impl->protocol_);
  piVar2 = socket_option::boolean<1,_2>::data<asio::ip::tcp>(option,&impl->protocol_);
  socket_option::boolean<1,_2>::size<asio::ip::tcp>(option,&impl->protocol_);
  socket_ops::setsockopt(__fd,(int)impl + 4,__optname,(void *)(ulong)uVar1,(socklen_t)piVar2);
  eVar3._0_8_ = *(ulong *)ec & 0xffffffff;
  eVar3._M_cat = ec->_M_cat;
  return eVar3;
}

Assistant:

asio::error_code set_option(implementation_type& impl,
      const Option& option, asio::error_code& ec)
  {
    socket_ops::setsockopt(impl.socket_, impl.state_,
        option.level(impl.protocol_), option.name(impl.protocol_),
        option.data(impl.protocol_), option.size(impl.protocol_), ec);
    return ec;
  }